

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
QPDFJob::PageSpec::PageSpec(PageSpec *this,string *filename,char *password,string *range)

{
  string *__s;
  allocator<char> local_69;
  string local_68;
  shared_ptr<char> local_48 [2];
  string *local_28;
  string *range_local;
  char *password_local;
  string *filename_local;
  PageSpec *this_local;
  
  local_28 = range;
  range_local = (string *)password;
  password_local = (char *)filename;
  filename_local = &this->filename;
  std::__cxx11::string::string((string *)this,(string *)filename);
  std::shared_ptr<char>::shared_ptr(&this->password);
  std::__cxx11::string::string((string *)&this->range,(string *)local_28);
  __s = range_local;
  if (range_local != (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,(char *)__s,&local_69);
    QUtil::make_shared_cstr((QUtil *)local_48,&local_68);
    std::shared_ptr<char>::operator=(&this->password,local_48);
    std::shared_ptr<char>::~shared_ptr(local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return;
}

Assistant:

QPDFJob::PageSpec::PageSpec(
    std::string const& filename, char const* password, std::string const& range) :
    filename(filename),
    range(range)
{
    if (password) {
        this->password = QUtil::make_shared_cstr(password);
    }
}